

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subdivision.cpp
# Opt level: O0

void __thiscall
CatmullClarkSubdivider::Subdivide
          (CatmullClarkSubdivider *this,aiMesh **smesh,size_t nmesh,aiMesh **out,uint num,
          bool discard_input)

{
  pointer *pppaVar1;
  value_type paVar2;
  aiMesh *this_00;
  Logger *pLVar3;
  size_type sVar4;
  size_type sVar5;
  reference ppaVar6;
  reference out_00;
  reference pvVar7;
  bool bVar8;
  ulong local_c8;
  size_t s_3;
  uint i_1;
  value_type local_b0;
  aiMesh *local_a8;
  aiMesh *i;
  size_t s_2;
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> maptbl;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> outmeshes;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> inmeshes;
  size_t s_1;
  size_t s;
  bool discard_input_local;
  uint num_local;
  aiMesh **out_local;
  size_t nmesh_local;
  aiMesh **smesh_local;
  CatmullClarkSubdivider *this_local;
  
  if (smesh == (aiMesh **)0x0) {
    __assert_fail("__null != smesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0x91,
                  "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                 );
  }
  if (out == (aiMesh **)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0x92,
                  "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                 );
  }
  if (out <= smesh && smesh + nmesh <= out + nmesh) {
    __assert_fail("smesh<out || smesh+nmesh>out+nmesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0x95,
                  "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                 );
  }
  if (num == 0) {
    if (discard_input) {
      for (s_1 = 0; s_1 < nmesh; s_1 = s_1 + 1) {
        out[s_1] = smesh[s_1];
        smesh[s_1] = (aiMesh *)0x0;
      }
    }
    else {
      for (inmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          inmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage < nmesh;
          inmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)inmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
        Assimp::SceneCombiner::Copy
                  (out + (long)inmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                   smesh[(long)inmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage]);
      }
    }
  }
  else {
    pppaVar1 = &outmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pppaVar1);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pppaVar1,nmesh);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,nmesh);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,nmesh);
    for (i = (aiMesh *)0x0; i < nmesh; i = (aiMesh *)((long)&i->mPrimitiveTypes + 1)) {
      local_a8 = smesh[(long)i];
      if ((local_a8->mPrimitiveTypes == 0) ||
         ((local_a8->mPrimitiveTypes & 3) != local_a8->mPrimitiveTypes)) {
        local_b0 = (value_type)0x0;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_b0);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   &outmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_a8);
        i_1 = (uint)i;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,&i_1);
      }
      else {
        pLVar3 = Assimp::DefaultLogger::get();
        Assimp::Logger::debug(pLVar3,"Catmull-Clark Subdivider: Skipping pure line/point mesh");
        if (discard_input) {
          out[(long)i] = local_a8;
          smesh[(long)i] = (aiMesh *)0x0;
        }
        else {
          Assimp::SceneCombiner::Copy(out + (long)i,local_a8);
        }
      }
    }
    sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                       &outmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    sVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                       &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar8 = false;
    if (sVar4 == sVar5) {
      sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                         &outmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      bVar8 = sVar4 == sVar5;
    }
    if (!bVar8) {
      __assert_fail("inmeshes.size()==outmeshes.size()&&inmeshes.size()==maptbl.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                    ,200,
                    "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                   );
    }
    bVar8 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                       &outmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar8) {
      pLVar3 = Assimp::DefaultLogger::get();
      Assimp::Logger::warn
                (pLVar3,"Catmull-Clark Subdivider: Pure point/line scene, I can\'t do anything");
    }
    else {
      pppaVar1 = &outmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      ppaVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::front
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pppaVar1);
      sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pppaVar1);
      out_00 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::front
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                          &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      InternSubdivide(this,ppaVar6,sVar4,out_00,num);
      for (s_3._4_4_ = 0;
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88),
          s_3._4_4_ < sVar4; s_3._4_4_ = s_3._4_4_ + 1) {
        ppaVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                             &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)s_3._4_4_);
        if (*ppaVar6 == (value_type)0x0) {
          __assert_fail("nullptr != outmeshes[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                        ,0xcf,
                        "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                       );
        }
        ppaVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                             &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)s_3._4_4_);
        paVar2 = *ppaVar6;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                            (ulong)s_3._4_4_);
        out[*pvVar7] = paVar2;
      }
      if (discard_input) {
        for (local_c8 = 0; local_c8 < nmesh; local_c8 = local_c8 + 1) {
          this_00 = smesh[local_c8];
          if (this_00 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(this_00);
            operator_delete(this_00,0x520);
          }
        }
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               &maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
               &outmeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void CatmullClarkSubdivider::Subdivide (
    aiMesh** smesh,
    size_t nmesh,
    aiMesh** out,
    unsigned int num,
    bool discard_input
    )
{
    ai_assert( NULL != smesh );
    ai_assert( NULL != out );

    // course, both regions may not overlap
    ai_assert(smesh<out || smesh+nmesh>out+nmesh);
    if (!num) {
        // No subdivision at all. Need to copy all the meshes .. argh.
        if (discard_input) {
            for (size_t s = 0; s < nmesh; ++s) {
                out[s] = smesh[s];
                smesh[s] = NULL;
            }
        }
        else {
            for (size_t s = 0; s < nmesh; ++s) {
                SceneCombiner::Copy(out+s,smesh[s]);
            }
        }
        return;
    }

    std::vector<aiMesh*> inmeshes;
    std::vector<aiMesh*> outmeshes;
    std::vector<unsigned int> maptbl;

    inmeshes.reserve(nmesh);
    outmeshes.reserve(nmesh);
    maptbl.reserve(nmesh);

    // Remove pure line and point meshes from the working set to reduce the
    // number of edge cases the subdivider is forced to deal with. Line and
    // point meshes are simply passed through.
    for (size_t s = 0; s < nmesh; ++s) {
        aiMesh* i = smesh[s];
        // FIX - mPrimitiveTypes might not yet be initialized
        if (i->mPrimitiveTypes && (i->mPrimitiveTypes & (aiPrimitiveType_LINE|aiPrimitiveType_POINT))==i->mPrimitiveTypes) {
            ASSIMP_LOG_DEBUG("Catmull-Clark Subdivider: Skipping pure line/point mesh");

            if (discard_input) {
                out[s] = i;
                smesh[s] = NULL;
            }
            else {
                SceneCombiner::Copy(out+s,i);
            }
            continue;
        }

        outmeshes.push_back(NULL);inmeshes.push_back(i);
        maptbl.push_back(static_cast<unsigned int>(s));
    }

    // Do the actual subdivision on the preallocated storage. InternSubdivide
    // *always* assumes that enough storage is available, it does not bother
    // checking any ranges.
    ai_assert(inmeshes.size()==outmeshes.size()&&inmeshes.size()==maptbl.size());
    if (inmeshes.empty()) {
        ASSIMP_LOG_WARN("Catmull-Clark Subdivider: Pure point/line scene, I can't do anything");
        return;
    }
    InternSubdivide(&inmeshes.front(),inmeshes.size(),&outmeshes.front(),num);
    for (unsigned int i = 0; i < maptbl.size(); ++i) {
        ai_assert(nullptr != outmeshes[i]);
        out[maptbl[i]] = outmeshes[i];
    }

    if (discard_input) {
        for (size_t s = 0; s < nmesh; ++s) {
            delete smesh[s];
        }
    }
}